

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d2tf.c
# Opt level: O2

void iauD2tf(int ndp,double days,char *sign,int *ihmsf)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  double dVar10;
  undefined8 local_58;
  undefined8 local_38;
  
  *sign = (days < 0.0) * '\x02' + '+';
  dVar1 = ABS(days) * 86400.0;
  if (ndp < 0) {
    iVar3 = 1;
    for (iVar4 = 0; -ndp != iVar4; iVar4 = iVar4 + 1) {
      iVar3 = iVar3 * ((uint)((iVar4 - 1U & 0xfffffffd) != 0) * 4 + 6);
    }
    dVar1 = dVar1 / (double)iVar3;
    uVar6 = 0;
    uVar8 = 0;
    if (0.5 <= ABS(dVar1)) {
      if (0.0 <= dVar1) {
        dVar1 = floor(dVar1 + 0.5);
        uVar6 = SUB84(dVar1,0);
        uVar8 = (undefined4)((ulong)dVar1 >> 0x20);
      }
      else {
        dVar1 = ceil(dVar1 + -0.5);
        uVar6 = SUB84(dVar1,0);
        uVar8 = (undefined4)((ulong)dVar1 >> 0x20);
      }
    }
    dVar1 = (double)CONCAT44(uVar8,uVar6) * (double)iVar3;
  }
  iVar3 = 1;
  iVar4 = 0;
  if (0 < ndp) {
    iVar4 = ndp;
  }
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    iVar3 = iVar3 * 10;
  }
  dVar2 = (double)iVar3;
  dVar10 = dVar2 * 60.0;
  dVar1 = dVar1 * dVar2;
  uVar6 = 0;
  uVar8 = 0;
  if (0.5 <= ABS(dVar1)) {
    if (0.0 <= dVar1) {
      dVar1 = floor(dVar1 + 0.5);
      uVar6 = SUB84(dVar1,0);
      uVar8 = (undefined4)((ulong)dVar1 >> 0x20);
    }
    else {
      dVar1 = ceil(dVar1 + -0.5);
      uVar6 = SUB84(dVar1,0);
      uVar8 = (undefined4)((ulong)dVar1 >> 0x20);
    }
  }
  local_58 = (double)CONCAT44(uVar8,uVar6);
  dVar1 = (double)CONCAT44(uVar8,uVar6) / (dVar10 * 60.0);
  if (0.0 <= dVar1) {
    dVar1 = floor(dVar1);
    uVar6 = SUB84(dVar1,0);
    uVar8 = (undefined4)((ulong)dVar1 >> 0x20);
  }
  else {
    dVar1 = ceil(dVar1);
    uVar6 = SUB84(dVar1,0);
    uVar8 = (undefined4)((ulong)dVar1 >> 0x20);
  }
  local_58 = local_58 - dVar10 * 60.0 * (double)CONCAT44(uVar8,uVar6);
  dVar1 = local_58 / dVar10;
  if (0.0 <= dVar1) {
    dVar1 = floor(dVar1);
    uVar7 = SUB84(dVar1,0);
    uVar9 = (undefined4)((ulong)dVar1 >> 0x20);
  }
  else {
    dVar1 = ceil(dVar1);
    uVar7 = SUB84(dVar1,0);
    uVar9 = (undefined4)((ulong)dVar1 >> 0x20);
  }
  local_38 = (double)CONCAT44(uVar9,uVar7);
  local_58 = local_58 - dVar10 * (double)CONCAT44(uVar9,uVar7);
  dVar1 = local_58 / dVar2;
  if (0.0 <= dVar1) {
    dVar1 = floor(dVar1);
    uVar7 = SUB84(dVar1,0);
    uVar9 = (undefined4)((ulong)dVar1 >> 0x20);
  }
  else {
    dVar1 = ceil(dVar1);
    uVar7 = SUB84(dVar1,0);
    uVar9 = (undefined4)((ulong)dVar1 >> 0x20);
  }
  *ihmsf = (int)(double)CONCAT44(uVar8,uVar6);
  ihmsf[1] = (int)local_38;
  ihmsf[2] = (int)(double)CONCAT44(uVar9,uVar7);
  ihmsf[3] = (int)(local_58 - dVar2 * (double)CONCAT44(uVar9,uVar7));
  return;
}

Assistant:

void iauD2tf(int ndp, double days, char *sign, int ihmsf[4])
/*
**  - - - - - - - -
**   i a u D 2 t f
**  - - - - - - - -
**
**  Decompose days to hours, minutes, seconds, fraction.
**
**  This function is part of the International Astronomical Union's
**  SOFA (Standards Of Fundamental Astronomy) software collection.
**
**  Status:  vector/matrix support function.
**
**  Given:
**     ndp     int     resolution (Note 1)
**     days    double  interval in days
**
**  Returned:
**     sign    char*   '+' or '-'
**     ihmsf   int[4]  hours, minutes, seconds, fraction
**
**  Notes:
**
**  1) The argument ndp is interpreted as follows:
**
**     ndp         resolution
**      :      ...0000 00 00
**     -7         1000 00 00
**     -6          100 00 00
**     -5           10 00 00
**     -4            1 00 00
**     -3            0 10 00
**     -2            0 01 00
**     -1            0 00 10
**      0            0 00 01
**      1            0 00 00.1
**      2            0 00 00.01
**      3            0 00 00.001
**      :            0 00 00.000...
**
**  2) The largest positive useful value for ndp is determined by the
**     size of days, the format of double on the target platform, and
**     the risk of overflowing ihmsf[3].  On a typical platform, for
**     days up to 1.0, the available floating-point precision might
**     correspond to ndp=12.  However, the practical limit is typically
**     ndp=9, set by the capacity of a 32-bit int, or ndp=4 if int is
**     only 16 bits.
**
**  3) The absolute value of days may exceed 1.0.  In cases where it
**     does not, it is up to the caller to test for and handle the
**     case where days is very nearly 1.0 and rounds up to 24 hours,
**     by testing for ihmsf[0]=24 and setting ihmsf[0-3] to zero.
**
**  This revision:  2021 May 11
**
**  SOFA release 2021-05-12
**
**  Copyright (C) 2021 IAU SOFA Board.  See notes at end.
*/
{
   int nrs, n;
   double rs, rm, rh, a, w, ah, am, as, af;


/* Handle sign. */
   *sign = (char) ( ( days >= 0.0 ) ? '+' : '-' );

/* Interval in seconds. */
   a = DAYSEC * fabs(days);

/* Pre-round if resolution coarser than 1s (then pretend ndp=1). */
   if (ndp < 0) {
      nrs = 1;
      for (n = 1; n <= -ndp; n++) {
          nrs *= (n == 2 || n == 4) ? 6 : 10;
      }
      rs = (double) nrs;
      w = a / rs;
      a = rs * dnint(w);
   }

/* Express the unit of each field in resolution units. */
   nrs = 1;
   for (n = 1; n <= ndp; n++) {
      nrs *= 10;
   }
   rs = (double) nrs;
   rm = rs * 60.0;
   rh = rm * 60.0;

/* Round the interval and express in resolution units. */
   a = dnint(rs * a);

/* Break into fields. */
   ah = a / rh;
   ah = dint(ah);
   a -= ah * rh;
   am = a / rm;
   am = dint(am);
   a -= am * rm;
   as = a / rs;
   as = dint(as);
   af = a - as * rs;

/* Return results. */
   ihmsf[0] = (int) ah;
   ihmsf[1] = (int) am;
   ihmsf[2] = (int) as;
   ihmsf[3] = (int) af;

/* Finished. */

/*----------------------------------------------------------------------
**
**  Copyright (C) 2021
**  Standards Of Fundamental Astronomy Board
**  of the International Astronomical Union.
**
**  =====================
**  SOFA Software License
**  =====================
**
**  NOTICE TO USER:
**
**  BY USING THIS SOFTWARE YOU ACCEPT THE FOLLOWING SIX TERMS AND
**  CONDITIONS WHICH APPLY TO ITS USE.
**
**  1. The Software is owned by the IAU SOFA Board ("SOFA").
**
**  2. Permission is granted to anyone to use the SOFA software for any
**     purpose, including commercial applications, free of charge and
**     without payment of royalties, subject to the conditions and
**     restrictions listed below.
**
**  3. You (the user) may copy and distribute SOFA source code to others,
**     and use and adapt its code and algorithms in your own software,
**     on a world-wide, royalty-free basis.  That portion of your
**     distribution that does not consist of intact and unchanged copies
**     of SOFA source code files is a "derived work" that must comply
**     with the following requirements:
**
**     a) Your work shall be marked or carry a statement that it
**        (i) uses routines and computations derived by you from
**        software provided by SOFA under license to you; and
**        (ii) does not itself constitute software provided by and/or
**        endorsed by SOFA.
**
**     b) The source code of your derived work must contain descriptions
**        of how the derived work is based upon, contains and/or differs
**        from the original SOFA software.
**
**     c) The names of all routines in your derived work shall not
**        include the prefix "iau" or "sofa" or trivial modifications
**        thereof such as changes of case.
**
**     d) The origin of the SOFA components of your derived work must
**        not be misrepresented;  you must not claim that you wrote the
**        original software, nor file a patent application for SOFA
**        software or algorithms embedded in the SOFA software.
**
**     e) These requirements must be reproduced intact in any source
**        distribution and shall apply to anyone to whom you have
**        granted a further right to modify the source code of your
**        derived work.
**
**     Note that, as originally distributed, the SOFA software is
**     intended to be a definitive implementation of the IAU standards,
**     and consequently third-party modifications are discouraged.  All
**     variations, no matter how minor, must be explicitly marked as
**     such, as explained above.
**
**  4. You shall not cause the SOFA software to be brought into
**     disrepute, either by misuse, or use for inappropriate tasks, or
**     by inappropriate modification.
**
**  5. The SOFA software is provided "as is" and SOFA makes no warranty
**     as to its use or performance.   SOFA does not and cannot warrant
**     the performance or results which the user may obtain by using the
**     SOFA software.  SOFA makes no warranties, express or implied, as
**     to non-infringement of third party rights, merchantability, or
**     fitness for any particular purpose.  In no event will SOFA be
**     liable to the user for any consequential, incidental, or special
**     damages, including any lost profits or lost savings, even if a
**     SOFA representative has been advised of such damages, or for any
**     claim by any third party.
**
**  6. The provision of any version of the SOFA software under the terms
**     and conditions specified herein does not imply that future
**     versions will also be made available under the same terms and
**     conditions.
*
**  In any published work or commercial product which uses the SOFA
**  software directly, acknowledgement (see www.iausofa.org) is
**  appreciated.
**
**  Correspondence concerning SOFA software should be addressed as
**  follows:
**
**      By email:  sofa@ukho.gov.uk
**      By post:   IAU SOFA Center
**                 HM Nautical Almanac Office
**                 UK Hydrographic Office
**                 Admiralty Way, Taunton
**                 Somerset, TA1 2DN
**                 United Kingdom
**
**--------------------------------------------------------------------*/
}